

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

pair<int,_float> * __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
get_data<directed_flag_complex_boundary_cell_t>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          directed_flag_complex_boundary_cell_t *vertices,int offset)

{
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  pair<int,_float> *ppVar3;
  runtime_error *this_01;
  key_type local_42;
  directed_flag_complex_boundary_cell_t local_40;
  
  if (dimension == 0) {
    return &this->data;
  }
  this_00 = &this->children->_M_t;
  if (this_00 ==
      (_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
       *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"A cell could not be found in the directed flag complex.");
  }
  else {
    iVar1 = (**(vertices->super_directed_flag_complex_cell_t)._vptr_directed_flag_complex_cell_t)
                      (vertices,(long)(offset + 1));
    local_42 = (key_type)iVar1;
    iVar2 = std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
            ::find(this_00,&local_42);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->children->_M_t)._M_impl.super__Rb_tree_header) {
      local_40.super_directed_flag_complex_cell_t.vertices =
           (vertices->super_directed_flag_complex_cell_t).vertices;
      local_40.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
           (_func_int **)&PTR_vertex_0015c2b0;
      local_40.i = vertices->i;
      ppVar3 = get_data<directed_flag_complex_boundary_cell_t>
                         ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
                          &iVar2._M_node[1]._M_parent,dimension + -1,&local_40,offset + 1);
      return ppVar3;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"A cell could not be found in the directed flag complex.");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const ExtraData& get_data(int dimension, const Cell vertices, int offset = 0) const {
		if (dimension == 0) return data;

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		return pair->second.get_data(dimension - 1, vertices, offset);
	}